

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O1

void __thiscall
Threadpool<Workerthread>::enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
          (Threadpool<Workerthread> *this,_func_void_position_ptr_limits_ptr_bool *f,position *args,
          limits *args_1,bool *args_2)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_60;
  _Bind<void_(*(std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>))(position_&,_limits_&,_bool)>
  local_50;
  
  local_60._M_device = &this->m;
  local_60._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  local_50._M_f = f;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<bool>_>.
  super__Head_base<2UL,_std::reference_wrapper<bool>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<bool>,_false>)
       (_Head_base<2UL,_std::reference_wrapper<bool>,_false>)args_2;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>.
  super__Head_base<1UL,_std::reference_wrapper<limits>,_false>._M_head_impl._M_data =
       (reference_wrapper<limits>)(reference_wrapper<limits>)args_1;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Head_base<0UL,_std::reference_wrapper<position>,_false>._M_head_impl._M_data =
       (reference_wrapper<position>)(reference_wrapper<position>)args;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::_Bind<void(*(std::reference_wrapper<position>,std::reference_wrapper<limits>,std::reference_wrapper<bool>))(position&,limits&,bool)>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->tasks,
             &local_50);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void enqueue(TT&& f, Args&&... args) {
		std::unique_lock<std::mutex> lock(m);
		// args to bind are copied or moved (not passed by reference) .. unless wrapped in std::ref()
		tasks.emplace_back(std::bind(std::forward<TT>(f), std::ref(std::forward<Args>(args))...));
		cv_task.notify_one();
	}